

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,int>
          (BaseAppender *this,Vector *col,char input)

{
  bool bVar1;
  InvalidInputException *this_00;
  char input_00;
  int result;
  int32_t local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<signed_char,int>(input,&local_3c,false);
  if (bVar1) {
    *(int32_t *)(col->data + (this->chunk).count * 4) = local_3c;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,int>(&local_38,(duckdb *)(ulong)(uint)(int)input,input_00);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}